

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_controller.cpp
# Opt level: O2

void __thiscall so_5::stats::impl::std_controller_t::~std_controller_t(std_controller_t *this)

{
  std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::~unique_ptr
            (&this->m_distribution_thread);
  std::condition_variable::~condition_variable(&this->m_wake_up_cond);
  intrusive_ptr_t<so_5::abstract_message_box_t>::~intrusive_ptr_t(&this->m_mbox);
  repository_t::~repository_t(&this->super_repository_t);
  controller_t::~controller_t(&this->super_controller_t);
  return;
}

Assistant:

std_controller_t::~std_controller_t()
	{}